

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::addPropertyStarts(Normalizer2Impl *this,USetAdder *sa,UErrorCode *param_2)

{
  UBool UVar1;
  uint16_t uVar2;
  ushort local_32;
  uint16_t local_2e;
  uint uStack_2c;
  UChar c;
  uint16_t fcd16;
  uint16_t prevFCD16;
  uint32_t value;
  UChar32 end;
  UChar32 start;
  UErrorCode *param_2_local;
  USetAdder *sa_local;
  Normalizer2Impl *this_local;
  
  value = 0;
  _end = param_2;
  param_2_local = (UErrorCode *)sa;
  sa_local = (USetAdder *)this;
  while (_fcd16 = ucptrie_getRange_63(this->normTrie,value,UCPMAP_RANGE_FIXED_LEAD_SURROGATES,1,
                                      (UCPMapValueFilter *)0x0,(void *)0x0,&stack0xffffffffffffffd4)
        , -1 < (int)_fcd16) {
    (**(code **)(param_2_local + 2))(*(undefined8 *)param_2_local,value);
    if (((value != _fcd16) && (UVar1 = isAlgorithmicNoNo(this,(uint16_t)uStack_2c), UVar1 != '\0'))
       && (2 < (uStack_2c & 6))) {
      local_2e = getFCD16(this,value);
      while (value = value + 1, (int)value <= (int)_fcd16) {
        uVar2 = getFCD16(this,value);
        if (uVar2 != local_2e) {
          (**(code **)(param_2_local + 2))(*(undefined8 *)param_2_local,value);
          local_2e = uVar2;
        }
      }
    }
    value = _fcd16 + 1;
  }
  for (local_32 = 0xac00; local_32 < 0xd7a4; local_32 = local_32 + 0x1c) {
    (**(code **)(param_2_local + 2))(*(undefined8 *)param_2_local,local_32);
    (**(code **)(param_2_local + 2))(*(undefined8 *)param_2_local,local_32 + 1);
  }
  (**(code **)(param_2_local + 2))(*(undefined8 *)param_2_local,0xd7a4);
  return;
}

Assistant:

void
Normalizer2Impl::addPropertyStarts(const USetAdder *sa, UErrorCode & /*errorCode*/) const {
    // Add the start code point of each same-value range of the trie.
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucptrie_getRange(normTrie, start, UCPMAP_RANGE_FIXED_LEAD_SURROGATES, INERT,
                                   nullptr, nullptr, &value)) >= 0) {
        sa->add(sa->set, start);
        if (start != end && isAlgorithmicNoNo((uint16_t)value) &&
                (value & Normalizer2Impl::DELTA_TCCC_MASK) > Normalizer2Impl::DELTA_TCCC_1) {
            // Range of code points with same-norm16-value algorithmic decompositions.
            // They might have different non-zero FCD16 values.
            uint16_t prevFCD16 = getFCD16(start);
            while (++start <= end) {
                uint16_t fcd16 = getFCD16(start);
                if (fcd16 != prevFCD16) {
                    sa->add(sa->set, start);
                    prevFCD16 = fcd16;
                }
            }
        }
        start = end + 1;
    }

    /* add Hangul LV syllables and LV+1 because of skippables */
    for(UChar c=Hangul::HANGUL_BASE; c<Hangul::HANGUL_LIMIT; c+=Hangul::JAMO_T_COUNT) {
        sa->add(sa->set, c);
        sa->add(sa->set, c+1);
    }
    sa->add(sa->set, Hangul::HANGUL_LIMIT); /* add Hangul+1 to continue with other properties */
}